

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

void __thiscall
pugi::impl::anon_unknown_0::xml_buffered_writer::flush
          (xml_buffered_writer *this,char_t *data,size_t size)

{
  byte *pbVar1;
  anon_union_8192_4_fbc60714_for_scratch *paVar2;
  ulong uVar3;
  uint16_t uVar4;
  uint32_t uVar5;
  byte bVar6;
  byte bVar7;
  xml_encoding xVar8;
  _func_int *UNRECOVERED_JUMPTABLE;
  value_type i;
  anon_union_8192_4_fbc60714_for_scratch *paVar9;
  anon_union_8192_4_fbc60714_for_scratch *paVar10;
  uint uVar11;
  uint *puVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  byte bVar17;
  
  if (size == 0) {
    return;
  }
  xVar8 = this->encoding;
  if (xVar8 == encoding_utf8) {
    UNRECOVERED_JUMPTABLE = this->writer->_vptr_xml_writer[2];
    (*UNRECOVERED_JUMPTABLE)(this->writer,data,size,UNRECOVERED_JUMPTABLE);
    return;
  }
  paVar2 = &this->scratch;
  paVar10 = paVar2;
  if ((xVar8 & ~encoding_utf8) != encoding_utf16_le) {
    if (xVar8 - encoding_utf32_le < 2) {
      paVar10 = (anon_union_8192_4_fbc60714_for_scratch *)
                utf8_decoder::process<pugi::impl::(anonymous_namespace)::utf32_writer>
                          (data,size,paVar2);
      paVar9 = paVar2;
      if (xVar8 != encoding_utf32_le) {
        for (; paVar9 != paVar10;
            paVar9 = (anon_union_8192_4_fbc60714_for_scratch *)((long)paVar9 + 4)) {
          uVar5 = swap_bytes(paVar9->data_u32[0]);
          paVar9->data_u32[0] = uVar5;
        }
      }
LAB_0010f94c:
      if ((ulong)((long)paVar10 - (long)paVar2->data_u8) < 0x2001) {
        (*this->writer->_vptr_xml_writer[2])(this->writer,paVar2);
        return;
      }
      __assert_fail("result <= sizeof(scratch)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0xe89,
                    "void pugi::impl::(anonymous namespace)::xml_buffered_writer::flush(const char_t *, size_t)"
                   );
    }
    if (xVar8 != encoding_latin1) {
      __assert_fail("false && \"Invalid encoding\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/pugixml/src/pugixml.cpp"
                    ,0xe67,
                    "size_t pugi::impl::(anonymous namespace)::convert_buffer_output(char_t *, uint8_t *, uint16_t *, uint32_t *, const char_t *, size_t, xml_encoding)"
                   );
    }
LAB_0010f98a:
    do {
      puVar12 = (uint *)data;
      lVar13 = 0;
      lVar14 = 3;
      while( true ) {
        if (size + lVar13 == 0) goto LAB_0010f94c;
        bVar6 = *(byte *)((long)puVar12 + lVar14 + -3);
        if (-1 < (char)bVar6) {
          size = (size - 1) + lVar13;
          paVar10->data_u8[0] = bVar6;
          paVar10 = (anon_union_8192_4_fbc60714_for_scratch *)(paVar10->data_u8 + 1);
          data = (char_t *)((long)puVar12 + (1 - lVar13));
          if ((size < 4) || ((((int)puVar12 - (int)lVar13) + 1U & 3) != 0)) goto LAB_0010f98a;
          goto LAB_0010fa99;
        }
        if ((((2 < size + lVar13) && ((bVar6 & 0xf0) == 0xe0)) &&
            (bVar17 = *(byte *)((long)puVar12 + lVar14 + -2), (bVar17 & 0xc0) == 0x80)) &&
           (bVar7 = *(byte *)((long)puVar12 + lVar14 + -1), (bVar7 & 0xc0) == 0x80)) break;
        lVar13 = lVar13 + -1;
        lVar14 = lVar14 + 1;
      }
      uVar11 = (uint)bVar17 << 6;
      size = (size - 3) + lVar13;
      bVar17 = bVar7 & 0x3f | (byte)uVar11;
      if ((uVar11 & 0xf00) != 0 || (bVar6 & 0xf) != 0) {
        bVar17 = 0x3f;
      }
      paVar10->data_u8[0] = bVar17;
      paVar10 = (anon_union_8192_4_fbc60714_for_scratch *)((long)paVar10 + 1);
      data = (char_t *)((long)puVar12 + (3 - lVar13));
    } while( true );
  }
LAB_0010f6e6:
  do {
    puVar12 = (uint *)data;
    lVar13 = 0;
    lVar14 = 3;
    while( true ) {
      uVar3 = size + lVar13;
      if (uVar3 == 0) {
        paVar9 = paVar2;
        if (xVar8 != encoding_utf16_le) {
          for (; paVar9 != paVar10;
              paVar9 = (anon_union_8192_4_fbc60714_for_scratch *)((long)paVar9 + 2)) {
            uVar4 = swap_bytes(paVar9->data_u16[0]);
            paVar9->data_u16[0] = uVar4;
          }
        }
        goto LAB_0010f94c;
      }
      bVar6 = *(byte *)((long)puVar12 + lVar14 + -3);
      uVar11 = (uint)bVar6;
      if (-1 < (char)bVar6) {
        *(ushort *)paVar10 = (ushort)bVar6;
        size = (size - 1) + lVar13;
        paVar10 = (anon_union_8192_4_fbc60714_for_scratch *)(paVar10->data_u16 + 1);
        data = (char_t *)((long)puVar12 + (1 - lVar13));
        if ((size < 4) || ((((int)puVar12 - (int)lVar13) + 1U & 3) != 0)) goto LAB_0010f6e6;
        goto LAB_0010f811;
      }
      if (((uVar3 != 1) && ((uVar11 & 0xffffffe0) == 0xc0)) &&
         (bVar17 = *(byte *)((long)puVar12 + lVar14 + -2), (bVar17 & 0xc0) == 0x80)) {
        size = (size - 2) + lVar13;
        paVar10->data_u16[0] = bVar17 & 0x3f | (ushort)((uVar11 & 0x1f) << 6);
        paVar10 = (anon_union_8192_4_fbc60714_for_scratch *)((long)paVar10 + 2);
        data = (char_t *)((long)puVar12 + (2 - lVar13));
        goto LAB_0010f6e6;
      }
      if ((((2 < uVar3) && ((uVar11 & 0xfffffff0) == 0xe0)) &&
          (bVar17 = *(byte *)((long)puVar12 + lVar14 + -2), (bVar17 & 0xc0) == 0x80)) &&
         (bVar7 = *(byte *)((long)puVar12 + lVar14 + -1), (bVar7 & 0xc0) == 0x80)) {
        size = (size - 3) + lVar13;
        paVar10->data_u16[0] = bVar7 & 0x3f | (bVar17 & 0x3f) << 6 | (ushort)bVar6 << 0xc;
        paVar10 = (anon_union_8192_4_fbc60714_for_scratch *)((long)paVar10 + 2);
        data = (char_t *)((long)puVar12 + (3 - lVar13));
        goto LAB_0010f6e6;
      }
      if (((3 < uVar3) && ((uVar11 & 0xfffffff8) == 0xf0)) &&
         ((uVar15 = (uint)*(byte *)((long)puVar12 + lVar14 + -2), (uVar15 & 0xffffffc0) == 0x80 &&
          ((bVar6 = *(byte *)((long)puVar12 + lVar14 + -1), (bVar6 & 0xc0) == 0x80 &&
           (bVar17 = *(byte *)((long)puVar12 + lVar14), (bVar17 & 0xc0) == 0x80)))))) break;
      lVar13 = lVar13 + -1;
      lVar14 = lVar14 + 1;
    }
    uVar16 = (uint)bVar6 << 6;
    size = (size - 4) + lVar13;
    paVar10->data_u16[0] =
         (short)((uVar16 & 0xc00) + 0x3ff0000 + ((uVar15 & 0x3f) << 0xc | (uVar11 & 7) << 0x12) >>
                10) + 0xd800;
    paVar10->data_u16[1] = bVar17 & 0x3f | (ushort)uVar16 & 0x3ff | 0xdc00;
    paVar10 = (anon_union_8192_4_fbc60714_for_scratch *)((long)paVar10 + 4);
    data = (char_t *)((long)puVar12 + (4 - lVar13));
  } while( true );
  while( true ) {
    paVar10->data_u8[0] = (byte)*(uint *)data;
    size = size - 4;
    paVar10->data_u8[1] = *(byte *)((long)data + 1);
    paVar10->data_u8[2] = *(byte *)((long)data + 2);
    pbVar1 = (byte *)((long)data + 3);
    data = (char_t *)((long)data + 4);
    paVar10->data_u8[3] = *pbVar1;
    paVar10 = (anon_union_8192_4_fbc60714_for_scratch *)(paVar10->data_u8 + 4);
    if (size < 4) break;
LAB_0010fa99:
    if ((*(uint *)data & 0x80808080) != 0) break;
  }
  goto LAB_0010f98a;
  while( true ) {
    size = size - 4;
    paVar10->data_u16[0] = (ushort)*(uint *)data & 0x7f;
    *(ushort *)((long)paVar10 + 2) = (ushort)*(byte *)((long)data + 1);
    *(ushort *)((long)paVar10 + 4) = (ushort)*(byte *)((long)data + 2);
    pbVar1 = (byte *)((long)data + 3);
    data = (char_t *)((long)data + 4);
    *(ushort *)((long)paVar10 + 6) = (ushort)*pbVar1;
    paVar10 = (anon_union_8192_4_fbc60714_for_scratch *)(paVar10->data_u16 + 4);
    if (size < 4) break;
LAB_0010f811:
    if ((*(uint *)data & 0x80808080) != 0) break;
  }
  goto LAB_0010f6e6;
}

Assistant:

void flush(const char_t* data, size_t size)
		{
			if (size == 0) return;

			// fast path, just write data
			if (encoding == get_write_native_encoding())
				writer.write(data, size * sizeof(char_t));
			else
			{
				// convert chunk
				size_t result = convert_buffer_output(scratch.data_char, scratch.data_u8, scratch.data_u16, scratch.data_u32, data, size, encoding);
				assert(result <= sizeof(scratch));

				// write data
				writer.write(scratch.data_u8, result);
			}
		}